

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

UnicodeString *
icu_63::TimeZone::getEquivalentID
          (UnicodeString *__return_storage_ptr__,UnicodeString *id,int32_t index)

{
  char *pcVar1;
  UBool UVar2;
  UResourceBundle *resB;
  ConstChar16Ptr local_248;
  UnicodeString local_240;
  UChar *local_200;
  UChar *id2;
  UResourceBundle *pUStack_1f0;
  int32_t idLen;
  UResourceBundle *ares;
  int32_t *v;
  undefined1 local_1d8 [4];
  int32_t size;
  UResourceBundle r;
  int32_t zone;
  UResourceBundle *top;
  undefined1 local_f0 [8];
  UResourceBundle res;
  UErrorCode ec;
  int32_t index_local;
  UnicodeString *id_local;
  UnicodeString *result;
  
  UnicodeString::UnicodeString(__return_storage_ptr__);
  res._196_4_ = 0;
  ures_initStackObject_63((UResourceBundle *)local_f0);
  resB = openOlsonResource(id,(UResourceBundle *)local_f0,(UErrorCode *)&res.field_0xc4);
  r._196_4_ = 0xffffffff;
  UVar2 = ::U_SUCCESS(res._196_4_);
  if (UVar2 != '\0') {
    ures_initStackObject_63((UResourceBundle *)local_1d8);
    ures_getByKey_63((UResourceBundle *)local_f0,"links",(UResourceBundle *)local_1d8,
                     (UErrorCode *)&res.field_0xc4);
    ares = (UResourceBundle *)
           ures_getIntVector_63
                     ((UResourceBundle *)local_1d8,(int32_t *)((long)&v + 4),
                      (UErrorCode *)&res.field_0xc4);
    UVar2 = ::U_SUCCESS(res._196_4_);
    if (((UVar2 != '\0') && (-1 < index)) && (index < v._4_4_)) {
      pcVar1 = ares->fResBuf + (long)index * 4 + -0x68;
      r._196_1_ = pcVar1[0];
      r._197_1_ = pcVar1[1];
      r._198_1_ = pcVar1[2];
      r._199_1_ = pcVar1[3];
    }
    ures_close_63((UResourceBundle *)local_1d8);
  }
  ures_close_63((UResourceBundle *)local_f0);
  if (-1 < (int)r._196_4_) {
    pUStack_1f0 = ures_getByKey_63(resB,"Names",(UResourceBundle *)0x0,(UErrorCode *)&res.field_0xc4
                                  );
    UVar2 = ::U_SUCCESS(res._196_4_);
    if (UVar2 != '\0') {
      id2._4_4_ = 0;
      local_200 = ures_getStringByIndex_63
                            (pUStack_1f0,r._196_4_,(int32_t *)((long)&id2 + 4),
                             (UErrorCode *)&res.field_0xc4);
      ConstChar16Ptr::ConstChar16Ptr(&local_248,local_200);
      UnicodeString::UnicodeString(&local_240,'\x01',&local_248,id2._4_4_);
      UnicodeString::fastCopyFrom(__return_storage_ptr__,&local_240);
      UnicodeString::~UnicodeString(&local_240);
      ConstChar16Ptr::~ConstChar16Ptr(&local_248);
    }
    ures_close_63(pUStack_1f0);
  }
  ures_close_63(resB);
  return __return_storage_ptr__;
}

Assistant:

const UnicodeString U_EXPORT2
TimeZone::getEquivalentID(const UnicodeString& id, int32_t index) {
    U_DEBUG_TZ_MSG(("gEI(%d)\n", index));
    UnicodeString result;
    UErrorCode ec = U_ZERO_ERROR;
    UResourceBundle res;
    ures_initStackObject(&res);
    UResourceBundle *top = openOlsonResource(id, res, ec);
    int32_t zone = -1;
    if (U_SUCCESS(ec)) {
        UResourceBundle r;
        ures_initStackObject(&r);
        int32_t size;
        ures_getByKey(&res, kLINKS, &r, &ec);
        const int32_t* v = ures_getIntVector(&r, &size, &ec);
        if (U_SUCCESS(ec)) {
            if (index >= 0 && index < size) {
                zone = v[index];
            }
        }
        ures_close(&r);
    }
    ures_close(&res);
    if (zone >= 0) {
        UResourceBundle *ares = ures_getByKey(top, kNAMES, NULL, &ec); // dereference Zones section
        if (U_SUCCESS(ec)) {
            int32_t idLen = 0;
            const UChar* id2 = ures_getStringByIndex(ares, zone, &idLen, &ec);
            result.fastCopyFrom(UnicodeString(TRUE, id2, idLen));
            U_DEBUG_TZ_MSG(("gei(%d) -> %d, len%d, %s\n", index, zone, result.length(), u_errorName(ec)));
        }
        ures_close(ares);
    }
    ures_close(top);
#if defined(U_DEBUG_TZ)
    if(result.length() ==0) {
      U_DEBUG_TZ_MSG(("equiv [__, #%d] -> 0 (%s)\n", index, u_errorName(ec)));
    }
#endif
    return result;
}